

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
clipp::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,man_page *man)

{
  pointer psVar1;
  size_type sVar2;
  ostream *poVar3;
  bool bVar4;
  section *section;
  pointer psVar5;
  doc_string secSpc;
  char local_51;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)man->sectionSpc_ + '\x01');
  psVar5 = (man->sections_).
           super__Vector_base<clipp::man_page::section,_std::allocator<clipp::man_page::section>_>.
           _M_impl.super__Vector_impl_data._M_start;
  psVar1 = (man->sections_).
           super__Vector_base<clipp::man_page::section,_std::allocator<clipp::man_page::section>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 != psVar1) {
    bVar4 = true;
    do {
      if ((psVar5->content_)._M_string_length != 0) {
        if (bVar4) {
          bVar4 = false;
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)os,(char *)local_50,local_48);
        }
        sVar2 = (psVar5->title_)._M_string_length;
        if (sVar2 != 0) {
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)os,(psVar5->title_)._M_dataplus._M_p,sVar2);
          local_51 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_51,1);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)os,(psVar5->content_)._M_dataplus._M_p,
                   (psVar5->content_)._M_string_length);
      }
      psVar5 = psVar5 + 1;
    } while (psVar5 != psVar1);
  }
  local_51 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,&local_51,1);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return os;
}

Assistant:

OStream&
operator << (OStream& os, const man_page& man)
{
    bool first = true;
    const auto secSpc = doc_string(man.section_row_spacing() + 1, '\n');
    for(const auto& section : man) {
        if(!section.content().empty()) {
            if(first) first = false; else os << secSpc;
            if(!section.title().empty()) os << section.title() << '\n';
            os << section.content();
        }
    }
    os << '\n';
    return os;
}